

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<unsigned_int> * __thiscall
kj::ArrayBuilder<unsigned_int>::operator=
          (ArrayBuilder<unsigned_int> *this,ArrayBuilder<unsigned_int> *other)

{
  ArrayBuilder<unsigned_int> *other_local;
  ArrayBuilder<unsigned_int> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (uint *)0x0;
  other->pos = (RemoveConst<unsigned_int> *)0x0;
  other->endPtr = (uint *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }